

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

fdb_status wal_snap_insert(snap_handle *shandle,fdb_doc *doc,uint64_t offset,wal_item_action action)

{
  undefined2 uVar1;
  avl_node *paVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 in_CL;
  avl_node *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  avl_node *node;
  wal_item *item;
  wal_item_header query_hdr;
  wal_item query;
  avl_cmp_func *in_stack_ffffffffffffff28;
  avl_node *in_stack_ffffffffffffff30;
  avl_tree *in_stack_ffffffffffffff38;
  avl_node *node_00;
  undefined6 in_stack_ffffffffffffff4a;
  avl_tree *in_stack_ffffffffffffff50;
  
  node_00 = (avl_node *)in_RSI[4];
  uVar1 = (undefined2)*in_RSI;
  paVar2 = avl_search(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  if (paVar2 == (avl_node *)0x0) {
    pvVar3 = calloc(1,0x80);
    pvVar4 = malloc(0x38);
    *(void **)((long)pvVar3 + 0x28) = pvVar4;
    *(undefined8 *)(*(long *)((long)pvVar3 + 0x28) + 0x18) = in_RSI[4];
    *(short *)(*(long *)((long)pvVar3 + 0x28) + 0x20) = (short)*in_RSI;
    *(undefined8 *)((long)pvVar3 + 0x58) = in_RSI[5];
    *(undefined1 *)((long)pvVar3 + 0x48) = in_CL;
    *(avl_node **)((long)pvVar3 + 0x50) = in_RDX;
    avl_insert((avl_tree *)CONCAT62(in_stack_ffffffffffffff4a,uVar1),node_00,
               (avl_cmp_func *)in_stack_ffffffffffffff38);
    avl_insert((avl_tree *)CONCAT62(in_stack_ffffffffffffff4a,uVar1),node_00,
               (avl_cmp_func *)in_stack_ffffffffffffff38);
    *(long *)(in_RDI + 0x88) = *(long *)(in_RDI + 0x88) + 1;
    if ((*(byte *)(in_RSI + 9) & 1) != 0) {
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
    }
    *(long *)((long)pvVar3 + 0x40) = in_RDI;
  }
  else {
    free(paVar2[-3].left[1].parent);
    paVar2[-3].left[1].parent = (avl_node *)in_RSI[4];
    *(short *)&paVar2[-3].left[1].left = (short)*in_RSI;
    if (paVar2[-1].left != (avl_node *)in_RSI[5]) {
      paVar2[-1].left = (avl_node *)in_RSI[5];
      avl_remove(in_stack_ffffffffffffff50,(avl_node *)CONCAT62(in_stack_ffffffffffffff4a,uVar1));
      avl_insert((avl_tree *)CONCAT62(in_stack_ffffffffffffff4a,uVar1),node_00,
                 (avl_cmp_func *)in_stack_ffffffffffffff38);
    }
    if ((*(char *)&paVar2[-2].right == '\0') && ((*(byte *)(in_RSI + 9) & 1) != 0)) {
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
    }
    else if ((*(char *)&paVar2[-2].right == '\x01') && ((*(byte *)(in_RSI + 9) & 1) == 0)) {
      *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + -1;
    }
    *(bool *)&paVar2[-2].right = (*(byte *)(in_RSI + 9) & 1) != 0;
    paVar2[-1].parent = in_RDX;
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status wal_snap_insert(struct snap_handle *shandle,
                           fdb_doc *doc,
                           uint64_t offset,
                           wal_item_action action)
{
    struct wal_item query;
    struct wal_item_header query_hdr;
    struct wal_item *item;
    struct avl_node *node;
    query_hdr.key = doc->key;
    query_hdr.keylen = doc->keylen;
    query.header = &query_hdr;
    node = avl_search(&shandle->key_tree, &query.avl_keysnap, _snap_cmp_bykey);

    if (!node) {
        item = (struct wal_item *) calloc(1, sizeof(struct wal_item));
        item->header = (struct wal_item_header *) malloc(
                                  sizeof(struct wal_item_header));
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        item->seqnum = doc->seqnum;
        item->action = action;
        item->offset = offset;
        avl_insert(&shandle->key_tree, &item->avl_keysnap, _snap_cmp_bykey);
        avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);

        // Note: same logic in wal_commit
        shandle->stat.wal_ndocs++;
        if (doc->deleted) {
            shandle->stat.wal_ndeletes++;
        }
        item->shandle = shandle;
    } else {
        // replace existing node with new values so there are no duplicates
        item = _get_entry(node, struct wal_item, avl_keysnap);
        free(item->header->key);
        item->header->key = doc->key;
        item->header->keylen = doc->keylen;
        if (item->seqnum != doc->seqnum) { // Re-index duplicate into seqtree
            item->seqnum = doc->seqnum;
            avl_remove(&shandle->seq_tree, &item->avl_seq);
            avl_insert(&shandle->seq_tree, &item->avl_seq, _wal_cmp_byseq);
        }

        // Note: same logic in wal_commit
        if (item->action == WAL_ACT_INSERT &&
            doc->deleted) {
            shandle->stat.wal_ndeletes++;
        } else if (item->action == WAL_ACT_LOGICAL_REMOVE &&
                   !doc->deleted) {
            shandle->stat.wal_ndeletes--;
        }

        item->action = doc->deleted ? WAL_ACT_LOGICAL_REMOVE : WAL_ACT_INSERT;
        item->offset = offset;
    }
    return FDB_RESULT_SUCCESS;
}